

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O3

string * __thiscall
banksia::getFullPath_abi_cxx11_(string *__return_storage_ptr__,banksia *this,char *path)

{
  char *__src;
  banksia *pbVar1;
  size_t sVar2;
  char buff [4096];
  char s [4096];
  char acStack_2018 [4096];
  banksia local_1018 [4096];
  
  pbVar1 = this;
  if ((*this == (banksia)0x7e) && (__src = getenv("HOME"), __src != (char *)0x0)) {
    strcpy((char *)local_1018,__src);
    strcat((char *)local_1018,(char *)(this + 1));
    pbVar1 = local_1018;
  }
  pbVar1 = (banksia *)realpath((char *)pbVar1,acStack_2018);
  if (pbVar1 != (banksia *)0x0) {
    this = pbVar1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,this,this + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string getFullPath(const char* path)
    {
#ifdef _WIN32
        char buff[_MAX_PATH];
        if (_fullpath( buff, path, _MAX_PATH) != NULL ) {
            return buff;
        }
        return path;
        
#else
        char buff[PATH_MAX];
        char *home, *ptr;
        if (*path == '~' && (home = getenv("HOME"))) {
            char s[PATH_MAX];
            ptr = realpath(strcat(strcpy(s, home), path+1), buff);
        } else {
            ptr = realpath(path, buff);
        }
        return ptr ? ptr : path;
#endif
    }